

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-vec.h
# Opt level: O2

void mp::AutoExpand<std::vector<bool,std::allocator<bool>>>
               (vector<bool,_std::allocator<bool>_> *vec,size_type i,value_type_conflict1 v)

{
  _Bit_type *p_Var1;
  ulong *puVar2;
  ulong uVar3;
  reference rVar4;
  
  p_Var1 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 <= i) {
    if ((ulong)(((long)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_end_of_storage - (long)p_Var1) * 8) <= i) {
      std::vector<bool,_std::allocator<bool>_>::reserve(vec,(i * 0xd + 0xd) / 10);
    }
    std::vector<bool,_std::allocator<bool>_>::resize(vec,i + 1,false);
  }
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](vec,i);
  puVar2 = rVar4._M_p;
  if (v) {
    uVar3 = rVar4._M_mask | *puVar2;
  }
  else {
    uVar3 = ~rVar4._M_mask & *puVar2;
  }
  *puVar2 = uVar3;
  return;
}

Assistant:

void AutoExpand(
		Vec& vec, typename Vec::size_type i, typename Vec::value_type v) {
  if (vec.size()<=i) {
    if (vec.capacity()<=i)
      vec.reserve(((i+1)*13)/10);
    vec.resize(i+1);
  }
	vec[i] = std::move(v);
}